

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

int lws_callback_vhost_protocols_vhost(lws_vhost *vh,int reason,void *in,size_t len)

{
  int iVar1;
  lws *wsi_00;
  lws *wsi;
  int n;
  size_t len_local;
  void *in_local;
  int reason_local;
  lws_vhost *vh_local;
  
  wsi_00 = (lws *)lws_zalloc(0x498,"fake wsi");
  if (wsi_00 == (lws *)0x0) {
    vh_local._4_4_ = 1;
  }
  else {
    (wsi_00->a).context = vh->context;
    lws_vhost_bind_wsi(vh,wsi_00);
    for (wsi._4_4_ = 0; wsi._4_4_ < ((wsi_00->a).vhost)->count_protocols; wsi._4_4_ = wsi._4_4_ + 1)
    {
      (wsi_00->a).protocol = vh->protocols + wsi._4_4_;
      iVar1 = (*((wsi_00->a).protocol)->callback)(wsi_00,reason,(void *)0x0,in,len);
      if (iVar1 != 0) {
        lws_realloc(wsi_00,0,"lws_free");
        return 1;
      }
    }
    lws_realloc(wsi_00,0,"lws_free");
    vh_local._4_4_ = 0;
  }
  return vh_local._4_4_;
}

Assistant:

int
lws_callback_vhost_protocols_vhost(struct lws_vhost *vh, int reason, void *in,
				   size_t len)
{
	int n;
	struct lws *wsi = lws_zalloc(sizeof(*wsi), "fake wsi");

	if (!wsi)
		return 1;

	wsi->a.context = vh->context;
	lws_vhost_bind_wsi(vh, wsi);

	for (n = 0; n < wsi->a.vhost->count_protocols; n++) {
		wsi->a.protocol = &vh->protocols[n];
		if (wsi->a.protocol->callback(wsi, (enum lws_callback_reasons)reason, NULL, in, len)) {
			lws_free(wsi);
			return 1;
		}
	}

	lws_free(wsi);

	return 0;
}